

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  double min;
  double *pdVar1;
  pointer end;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var2;
  int *piVar3;
  ulong uVar4;
  pointer ppVar5;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  end_00;
  long lVar6;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin;
  double dVar7;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  q;
  allocator_type local_69;
  _Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_68;
  quadratic_cost_type<double> *local_50;
  _Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  local_48;
  
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)&local_68,
             (long)n,(allocator_type *)&local_48);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  ::vector((vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
            *)&local_48,
           (long)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[n],&local_69);
  pdVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  piVar3 = &(local_68._M_impl.super__Vector_impl_data._M_start)->second;
  for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
    ((pair<double,_int> *)(piVar3 + -2))->first = pdVar1[uVar4];
    *piVar3 = (int)uVar4;
    piVar3 = piVar3 + 4;
  }
  local_50 = this;
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (local_68._M_impl.super__Vector_impl_data._M_start,
             local_68._M_impl.super__Vector_impl_data._M_finish);
  end = local_68._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
  begin._M_current = local_68._M_impl.super__Vector_impl_data._M_start;
  for (end_00._M_current = local_68._M_impl.super__Vector_impl_data._M_start;
      end_00._M_current != end; end_00._M_current = end_00._M_current + 1) {
    dVar7 = (end_00._M_current)->first;
    min = (begin._M_current)->first;
    if (((dVar7 != min) || (_Var2._M_current = begin._M_current, NAN(dVar7) || NAN(min))) &&
       (_Var2._M_current = end_00._M_current, 0x10 < (long)ppVar5 - (long)begin._M_current)) {
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                (begin,end_00,rng,min,dVar7);
    }
    ppVar5 = ppVar5 + 1;
    begin._M_current = _Var2._M_current;
  }
  if (0x10 < (long)end - (long)begin._M_current) {
    if ((long)begin._M_current - (long)local_68._M_impl.super__Vector_impl_data._M_start == 0) {
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                (begin,(__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,(begin._M_current)->first + 1.0);
    }
    else {
      dVar7 = linearize<long,double>
                        (0,(local_68._M_impl.super__Vector_impl_data._M_start)->first,
                         (long)begin._M_current -
                         (long)local_68._M_impl.super__Vector_impl_data._M_start >> 4,
                         (begin._M_current)->first,
                         (long)local_68._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_68._M_impl.super__Vector_impl_data._M_start >> 4);
      random_epsilon_unique<double,__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
                (begin,(__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,dVar7);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
            (local_68._M_impl.super__Vector_impl_data._M_start);
  pdVar1 = (local_50->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  for (lVar6 = 0; (ulong)(uint)n << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(undefined8 *)((long)pdVar1 + lVar6) =
         *(undefined8 *)
          ((long)&(local_68._M_impl.super__Vector_impl_data._M_start)->first + lVar6 * 2);
  }
  make_loo_norm(local_50,n);
  std::
  _Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  ::~_Vector_base(&local_48);
  std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~_Vector_base
            (&local_68);
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }